

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NtpReply.h
# Opt level: O3

qint64 __thiscall NtpReply::localClockOffset(NtpReply *this)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  QDateTime aQStack_38 [8];
  QDateTime local_30 [8];
  QDateTime local_28 [8];
  QDateTime local_20 [8];
  
  uVar1 = (this->m_packet).basic.originateTimestamp.seconds;
  uVar2 = (this->m_packet).basic.originateTimestamp.fraction;
  QDateTime::fromMSecsSinceEpoch
            (local_20,(ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                             uVar1 << 0x18) * 1000 + -0x20251fe2400 +
                      ((ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                              uVar2 << 0x18) * 1000 >> 0x20),0,0);
  uVar1 = (this->m_packet).basic.receiveTimestamp.seconds;
  uVar2 = (this->m_packet).basic.receiveTimestamp.fraction;
  QDateTime::fromMSecsSinceEpoch
            (local_28,(ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                             uVar1 << 0x18) * 1000 + -0x20251fe2400 +
                      ((ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                              uVar2 << 0x18) * 1000 >> 0x20),0,0);
  lVar3 = QDateTime::msecsTo(local_20);
  QDateTime::QDateTime(local_30,&this->m_destinationTime);
  uVar1 = (this->m_packet).basic.transmitTimestamp.seconds;
  uVar2 = (this->m_packet).basic.transmitTimestamp.fraction;
  QDateTime::fromMSecsSinceEpoch
            (aQStack_38,
             (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
                    ) * 1000 + -0x20251fe2400 +
             ((ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                     uVar2 << 0x18) * 1000 >> 0x20),0,0);
  lVar4 = QDateTime::msecsTo(local_30);
  QDateTime::~QDateTime(aQStack_38);
  QDateTime::~QDateTime(local_30);
  QDateTime::~QDateTime(local_28);
  QDateTime::~QDateTime(local_20);
  return (lVar4 + lVar3) / 2;
}

Assistant:

qint64 localClockOffset() const {
        return (originTime().msecsTo(receiveTime()) + destinationTime().msecsTo(transmitTime())) / 2;
    }